

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O2

void __thiscall JsonTest::TestResult::TestResult(TestResult *this)

{
  this->predicateId_ = 1;
  std::_Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>::_Deque_base
            (&(this->failures_).
              super__Deque_base<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->lastUsedPredicateId_ = 0;
  this->messageTarget_ = (Failure *)0x0;
  (this->rootPredicateNode_).id_ = 0;
  (this->rootPredicateNode_).next_ = (PredicateContext *)0x0;
  this->predicateStackTail_ = &this->rootPredicateNode_;
  return;
}

Assistant:

TestResult::TestResult()
    : predicateId_(1), lastUsedPredicateId_(0), messageTarget_(0) {
  // The root predicate has id 0
  rootPredicateNode_.id_ = 0;
  rootPredicateNode_.next_ = 0;
  predicateStackTail_ = &rootPredicateNode_;
}